

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_TableFileIndexData::_Run(_Test_TableFileIndexData *this)

{
  _func_int **in_RAX;
  DB local_18;
  
  local_18._vptr_DB = in_RAX;
  CorruptionTest::Build(&this->super_CorruptionTest,10000);
  DBImpl::TEST_CompactMemTable((DBImpl *)&stack0xffffffffffffffe8);
  if (local_18._vptr_DB != (_func_int **)0x0) {
    operator_delete__(local_18._vptr_DB);
  }
  CorruptionTest::Corrupt(&this->super_CorruptionTest,kTableFile,-2000,500);
  CorruptionTest::Reopen(&this->super_CorruptionTest);
  CorruptionTest::Check(&this->super_CorruptionTest,5000,9999);
  return;
}

Assistant:

TEST(CorruptionTest, TableFileIndexData) {
  Build(10000);  // Enough to build multiple Tables
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);
  dbi->TEST_CompactMemTable();

  Corrupt(kTableFile, -2000, 500);
  Reopen();
  Check(5000, 9999);
}